

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O2

tuple<unsigned_long,_unsigned_long,_long> * __thiscall
greater_filtration_or_better_pivot_or_smaller_index::get_coboundary_size_and_gap_and_pivot
          (tuple<unsigned_long,_unsigned_long,_long> *__return_storage_ptr__,
          greater_filtration_or_better_pivot_or_smaller_index *this,index_t a)

{
  long lVar1;
  unsigned_long uVar2;
  long lVar3;
  unsigned_long uVar4;
  filtration_entry_t fVar5;
  simplex_coboundary_enumerator iterator;
  simplex_coboundary_enumerator local_48;
  
  local_48.complex = this->complex;
  local_48.dim = this->dimension;
  local_48.idx_above = 0;
  local_48.simplex =
       (delta_complex_cell_t *)
       (a * 0xe8 +
       *(long *)&((local_48.complex)->cells).
                 super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_48.dim].
                 super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>.
                 _M_impl);
  uVar4 = 0;
  uVar2 = 0;
  lVar3 = 0;
  while ((ulong)local_48.idx_above <
         (ulong)((long)((local_48.simplex)->coboundary).
                       super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)((local_48.simplex)->coboundary).
                       super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3)) {
    uVar4 = uVar4 + 1;
    fVar5 = simplex_coboundary_enumerator::next(&local_48);
    lVar1 = fVar5.super_pair<float,_long>.second;
    if (lVar1 - lVar3 != 0 && lVar3 <= lVar1) {
      uVar2 = lVar1 - lVar3;
      lVar3 = lVar1;
    }
  }
  (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_long>).
  super__Tuple_impl<1UL,_unsigned_long,_long>.super__Tuple_impl<2UL,_long>.
  super__Head_base<2UL,_long,_false>._M_head_impl = lVar3;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_long>).
  super__Tuple_impl<1UL,_unsigned_long,_long>.super__Head_base<1UL,_unsigned_long,_false>.
  _M_head_impl = uVar2;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_long>).
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar4;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<size_t, size_t, index_t> get_coboundary_size_and_gap_and_pivot(index_t a) const {
		// Look at the first two gaps of the pivot and the next element
		index_t pivot = 0;
		size_t gap_after_pivot = 0;
		simplex_coboundary_enumerator iterator(a,dimension,complex);
		size_t coboundary_size = 0;
		while (iterator.has_next()) {
			coboundary_size++;
			index_t next_index = get_index(iterator.next().second);
			if (next_index > pivot) {
				gap_after_pivot = next_index - pivot;
				pivot = next_index;
			}
		}

		return std::make_tuple(coboundary_size, gap_after_pivot, pivot);
	}